

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng::encode(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,
                    vector<unsigned_char,_std::allocator<unsigned_char>_> *in,uint w,uint h,
                    LodePNGColorType colortype,uint bitdepth)

{
  bool bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  uint unaff_retaddr;
  uint unaff_retaddr_00;
  uchar *in_stack_00000008;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000010;
  undefined8 in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  uint in_stack_fffffffffffffff8;
  LodePNGColorType in_stack_fffffffffffffffc;
  uint uVar3;
  
  this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
         lodepng_get_raw_size_lct
                   ((uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20),(uint)in_stack_ffffffffffffffd0
                    ,(LodePNGColorType)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                    (uint)in_stack_ffffffffffffffc8);
  pvVar2 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RSI);
  if (pvVar2 < this) {
    uVar3 = 0x54;
  }
  else {
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(this);
    if (!bVar1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RSI,0);
    }
    uVar3 = encode(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                   in_stack_fffffffffffffffc,in_stack_fffffffffffffff8);
  }
  return uVar3;
}

Assistant:

unsigned encode(std::vector<unsigned char>& out,
                const std::vector<unsigned char>& in, unsigned w, unsigned h,
                LodePNGColorType colortype, unsigned bitdepth) {
  if(lodepng_get_raw_size_lct(w, h, colortype, bitdepth) > in.size()) return 84;
  return encode(out, in.empty() ? 0 : &in[0], w, h, colortype, bitdepth);
}